

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<true,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long v1;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  void *pvVar7;
  undefined8 *puVar8;
  MessageLite *msg_00;
  ushort *p;
  Nonnull<const_char_*> pcVar9;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar10;
  ulong uVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar12;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  uint uVar13;
  uint *puVar14;
  RepeatedPtrFieldBase *ptr_00;
  ushort uVar15;
  int iVar16;
  long v1_00;
  long *plVar17;
  Arena *this;
  pair<const_char_*,_unsigned_int> pVar18;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcParser local_48 [16];
  RepeatedPtrFieldBase *local_38;
  
  puVar14 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar14 & 3) != 0) {
    AlignFail(puVar14);
  }
  uVar3 = *(ushort *)((long)puVar14 + 10);
  if ((ulong)(uVar3 & 0x30) == 0x20) {
    pcVar9 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((ulong)(uVar3 & 0x30),0x20,
                        "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                       );
  }
  if (pcVar9 == (Nonnull<const_char_*>)0x0) {
    if ((ulong)(uVar3 & 0x1c0) == 0x40) {
      pcVar9 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)(uVar3 & 0x1c0),0x40,
                          "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepGroup)"
                         );
    }
    if (pcVar9 == (Nonnull<const_char_*>)0x0) {
      uVar6 = data.field_0._0_4_;
      if ((uVar6 & 7) != 3) {
        UNRECOVERED_JUMPTABLE = table->fallback;
LAB_0022b6d7:
        pcVar10 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar10;
      }
      pvVar7 = MaybeGetSplitBase(msg,true,table);
      plVar17 = (long *)((ulong)*puVar14 + (long)pvVar7);
      if (((ulong)plVar17 & 7) != 0) {
        AlignFail(plVar17);
      }
      if ((undefined1 *)*plVar17 == kZeroBuffer) {
        this = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)this & 1) != 0) {
          this = *(Arena **)((ulong)this & 0xfffffffffffffffe);
        }
        if (this == (Arena *)0x0) {
          puVar8 = (undefined8 *)operator_new(0x18);
          *puVar8 = 0;
          puVar8[1] = 0;
          puVar8[2] = 0;
        }
        else {
          puVar8 = (undefined8 *)Arena::Allocate(this,0x18);
          *puVar8 = 0;
          puVar8[1] = 0;
          puVar8[2] = this;
        }
        *plVar17 = (long)puVar8;
      }
      local_38 = (RepeatedPtrFieldBase *)*plVar17;
      local_58 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  ((long)&table->has_bits_offset +
                  (ulong)(ushort)puVar14[2] * 8 + (ulong)table->aux_offset);
      uVar15 = uVar3 >> 9 & 3;
      if (uVar15 != 2) {
        if ((uVar3 >> 9 & 3) == 0) {
          MpRepeatedMessageOrGroup<true,true>(local_48);
          goto LAB_0022b825;
        }
        if (uVar15 != 1) {
          local_58.data = *local_58.data;
        }
        local_58.data = (uint64_t)MessageLite::GetTcParseTable(local_58.data);
      }
      do {
        ptr_00 = local_38;
        msg_00 = AddMessage((TcParseTableBase *)local_58,local_38);
        aVar12 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)ctx->depth_;
        v1 = aVar12.data - 1;
        iVar5 = (int)v1;
        ctx->depth_ = iVar5;
        if ((long)aVar12.data < 1) {
          p = (ushort *)0x0;
          ctx_00 = extraout_RDX;
        }
        else {
          v1_00 = (long)ctx->group_depth_ + 1;
          iVar16 = (int)v1_00;
          ctx->group_depth_ = iVar16;
          aVar12 = local_58;
          ptr_00 = (RepeatedPtrFieldBase *)ptr;
          p = (ushort *)ParseLoopPreserveNone(msg_00,ptr,ctx,(TcParseTableBase *)local_58);
          ctx_00 = extraout_RDX_00;
          if (p != (ushort *)0x0) {
            if (iVar5 == ctx->depth_) {
              pcVar9 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (v1,(long)ctx->depth_,"old_depth == depth_");
              ctx_00 = extraout_RDX_01;
            }
            if (pcVar9 == (Nonnull<const_char_*>)0x0) {
              ptr_00 = (RepeatedPtrFieldBase *)(long)ctx->group_depth_;
              if (iVar16 == ctx->group_depth_) {
                pcVar9 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                   (v1_00,(long)ptr_00,"old_group_depth == group_depth_");
                ctx_00 = extraout_RDX_02;
              }
              if (pcVar9 == (Nonnull<const_char_*>)0x0) goto LAB_0022b604;
            }
            else {
              MpRepeatedMessageOrGroup<true,true>();
            }
            MpRepeatedMessageOrGroup<true,true>();
            goto LAB_0022b844;
          }
LAB_0022b604:
          ctx->group_depth_ = ctx->group_depth_ + -1;
          ctx->depth_ = ctx->depth_ + 1;
          uVar13 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          msg_00 = (MessageLite *)0x0;
          if (uVar13 != uVar6) {
            p = (ushort *)0x0;
          }
        }
        pVar18._8_8_ = ctx_00;
        pVar18.first = (char *)msg_00;
        if (p == (ushort *)0x0) {
          iVar5 = 8;
        }
        else if (p < (ctx->super_EpsCopyInputStream).limit_end_) {
          bVar1 = (byte)*p;
          puVar14 = (uint *)(ulong)bVar1;
          ptr = (char *)((long)p + 1);
          if ((char)bVar1 < '\0') {
            bVar2 = *(byte *)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = ctx_00;
            pVar18 = (pair<const_char_*,_unsigned_int>)(auVar4 << 0x40);
            aVar12.data = (ulong)bVar2 << 7;
            uVar13 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            puVar14 = (uint *)(ulong)uVar13;
            if ((char)bVar2 < '\0') {
              ptr_00 = (RepeatedPtrFieldBase *)(ulong)uVar13;
              pVar18 = ReadTagFallback((char *)p,uVar13);
              ptr = pVar18.first;
              puVar14 = (uint *)(ulong)pVar18.second;
            }
            else {
              ptr = (char *)(p + 1);
            }
          }
          ctx_00 = pVar18._8_8_;
          iVar5 = (uint)((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) << 3;
        }
        else {
          iVar5 = 9;
        }
        if (iVar5 != 0) {
          if (iVar5 == 8) {
            pcVar10 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)aVar12,table,hasbits);
            return pcVar10;
          }
          goto LAB_0022b74b;
        }
      } while ((uint)puVar14 == uVar6);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) {
LAB_0022b74b:
        if ((ulong)table->has_bits_offset != 0) {
          puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar14 & 3) != 0) {
LAB_0022b825:
            AlignFail();
          }
          *puVar14 = *puVar14 | (uint)hasbits;
        }
        return (char *)p;
      }
      uVar6 = (uint)table->fast_idx_mask & (uint)*p;
      if ((uVar6 & 7) == 0) {
        uVar11 = (ulong)(uVar6 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*p ^ *(ulong *)(&table[1].fast_idx_mask + uVar11 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar11);
        ptr = (char *)p;
        goto LAB_0022b6d7;
      }
      goto LAB_0022b85e;
    }
  }
  else {
LAB_0022b844:
    MpRepeatedMessageOrGroup<true,true>();
  }
  MpRepeatedMessageOrGroup<true,true>();
LAB_0022b85e:
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}